

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
Operation<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
          (ArgMinMaxBase<duckdb::LessThan,true> *this,
          ArgMinMaxState<duckdb::hugeint_t,_double> *state,hugeint_t *x,double *y,
          AggregateBinaryInput *binary)

{
  uint64_t uVar1;
  hugeint_t x_data;
  
  if (*this != (ArgMinMaxBase<duckdb::LessThan,true>)0x0) {
    x_data.upper = (int64_t)y;
    x_data.lower = (state->arg).lower;
    Execute<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>>
              (this,*(ArgMinMaxState<duckdb::hugeint_t,_double> **)state,x_data,(double)x->lower,
               binary);
    return;
  }
  TemplatedValidityMask<unsigned_long>::RowIsValid
            ((TemplatedValidityMask<unsigned_long> *)y[1],(idx_t)y[3]);
  uVar1 = (state->arg).lower;
  *(undefined8 *)(this + 8) = *(undefined8 *)state;
  *(uint64_t *)(this + 0x10) = uVar1;
  *(uint64_t *)(this + 0x18) = x->lower;
  *this = (ArgMinMaxBase<duckdb::LessThan,true>)0x1;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}